

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void tr_partition(int *ISAd,int *first,int *middle,int *last,int **pa,int **pb,int v)

{
  int iVar1;
  bool bVar2;
  int x;
  int s;
  int t;
  int *f;
  int *e;
  int *d;
  int *c;
  int *b;
  int *a;
  int **pb_local;
  int **pa_local;
  int *last_local;
  int *middle_local;
  int *first_local;
  int *ISAd_local;
  
  x = 0;
  b = middle + -1;
  do {
    b = b + 1;
    bVar2 = false;
    if (b < last) {
      x = ISAd[*b];
      bVar2 = x == v;
    }
  } while (bVar2);
  c = last;
  a = b;
  if ((b < last) && (x < v)) {
    while( true ) {
      b = b + 1;
      bVar2 = false;
      if (b < last) {
        x = ISAd[*b];
        bVar2 = x <= v;
      }
      if (!bVar2) break;
      if (x == v) {
        iVar1 = *b;
        *b = *a;
        *a = iVar1;
        a = a + 1;
      }
    }
  }
  do {
    d = c + -1;
    bVar2 = false;
    if (b < d) {
      x = ISAd[*d];
      bVar2 = x == v;
    }
    c = d;
  } while (bVar2);
  if ((b < d) && (v < x)) {
    while( true ) {
      c = c + -1;
      bVar2 = false;
      if (b < c) {
        x = ISAd[*c];
        bVar2 = v <= x;
      }
      if (!bVar2) break;
      if (x == v) {
        iVar1 = *c;
        *c = *d;
        *d = iVar1;
        d = d + -1;
      }
    }
  }
  while (b < c) {
    iVar1 = *b;
    *b = *c;
    *c = iVar1;
    while( true ) {
      b = b + 1;
      bVar2 = false;
      if (b < c) {
        x = ISAd[*b];
        bVar2 = x <= v;
      }
      if (!bVar2) break;
      if (x == v) {
        iVar1 = *b;
        *b = *a;
        *a = iVar1;
        a = a + 1;
      }
    }
    while( true ) {
      c = c + -1;
      bVar2 = false;
      if (b < c) {
        x = ISAd[*c];
        bVar2 = v <= x;
      }
      if (!bVar2) break;
      if (x == v) {
        iVar1 = *c;
        *c = *d;
        *d = iVar1;
        d = d + -1;
      }
    }
  }
  last_local = last;
  first_local = first;
  if (a <= d) {
    s = (int)((long)a - (long)first >> 2);
    iVar1 = (int)((long)b - (long)a >> 2);
    if (iVar1 < s) {
      s = iVar1;
    }
    f = b + -(long)s;
    e = first;
    for (; 0 < s; s = s + -1) {
      iVar1 = *e;
      *e = *f;
      *f = iVar1;
      e = e + 1;
      f = f + 1;
    }
    s = (int)((long)d - (long)(b + -1) >> 2);
    iVar1 = (int)((long)last - (long)d >> 2) + -1;
    if (iVar1 < s) {
      s = iVar1;
    }
    e = b;
    f = last + -(long)s;
    for (; 0 < s; s = s + -1) {
      iVar1 = *e;
      *e = *f;
      *f = iVar1;
      e = e + 1;
      f = f + 1;
    }
    first_local = first + ((long)b - (long)a >> 2);
    last_local = last + -((long)d - (long)(b + -1) >> 2);
  }
  *pa = first_local;
  *pb = last_local;
  return;
}

Assistant:

static INLINE
void
tr_partition(const int *ISAd,
             int *first, int *middle, int *last,
             int **pa, int **pb, int v) {
  int *a, *b, *c, *d, *e, *f;
  int t, s;
  int x = 0;

  for(b = middle - 1; (++b < last) && ((x = ISAd[*b]) == v);) { }
  if(((a = b) < last) && (x < v)) {
    for(; (++b < last) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
  }
  for(c = last; (b < --c) && ((x = ISAd[*c]) == v);) { }
  if((b < (d = c)) && (x > v)) {
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }
  for(; b < c;) {
    SWAP(*b, *c);
    for(; (++b < c) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }

  if(a <= d) {
    c = b - 1;
    if((s = a - first) > (t = b - a)) { s = t; }
    for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    if((s = d - c) > (t = last - d - 1)) { s = t; }
    for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    first += (b - a), last -= (d - c);
  }
  *pa = first, *pb = last;
}